

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

bool __thiscall
cmGlobalNinjaGenerator::WriteDyndepFile
          (cmGlobalNinjaGenerator *this,string *dir_top_src,string *dir_top_bld,string *dir_cur_src,
          string *dir_cur_bld,string *arg_dd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_ddis,string *module_dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *linked_target_dirs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forward_modules_from_target_dirs,string *arg_lang,string *arg_modmapfmt,
          cmCxxModuleExportInfo *export_info)

{
  _Rb_tree_color _Var1;
  cmake *pcVar2;
  string *psVar3;
  pointer pcVar4;
  pointer pcVar5;
  ValueHolder VVar6;
  size_type *psVar7;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Elt_pointer pEVar11;
  _Elt_pointer pEVar12;
  pointer pbVar13;
  pointer pbVar14;
  undefined1 uVar15;
  bool bVar16;
  int iVar17;
  __uniq_ptr_data<cmMakefile,_std::default_delete<cmMakefile>,_true,_true> this_00;
  Value *pVVar18;
  Value *pVVar19;
  Value *pVVar20;
  iterator __position;
  _Link_type __z;
  uchar *puVar21;
  iterator __x;
  mapped_type *pmVar22;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_01;
  mapped_type *pmVar23;
  string *psVar24;
  iterator iVar25;
  _Rb_tree_node_base *p_Var26;
  _Base_ptr p_Var27;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  *p_Var28;
  cmScanDepInfo *pcVar29;
  _Link_type p_Var30;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  *p_Var31;
  long lVar32;
  Value *source;
  Value *source_00;
  Value *source_01;
  undefined8 uVar33;
  ulong uVar34;
  char *pcVar35;
  undefined8 uVar36;
  _Head_base<0UL,_cmMakefile_*,_false> _Var38;
  _Any_data *cb;
  _Elt_pointer pEVar39;
  cmSourceReqInfo *r;
  pointer pcVar40;
  ValueHolder *pVVar41;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_10;
  const_iterator cVar42;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar43;
  static_string_view sVar44;
  string_view separator;
  Value target_module_info;
  string target_mods_file;
  Value ltm;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> lgd;
  bool private_usage_found;
  vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> objects;
  Value target_modules;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
  mod_files;
  cmGeneratedFileStream tmf;
  CxxModuleUsage usages;
  cmGeneratedFileStream ddf;
  _Any_data __tmp_3;
  _Any_data __tmp_6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8b8;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  local_8a8;
  code *pcStack_8a0;
  pointer local_888;
  CxxModuleMapFormat local_87c;
  ValueHolder local_878;
  pointer local_870;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  local_868;
  undefined8 local_860;
  char *local_858;
  long local_850;
  undefined1 local_848 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_838;
  undefined1 local_828 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_818;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7f8;
  _Elt_pointer ppVStack_7f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7d8;
  _Elt_pointer ppVStack_7d0;
  cmScanDepInfo *local_7c8;
  cmScanDepInfo *local_7c0;
  ValueHolder *local_7b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7b0;
  undefined1 local_7a8 [8];
  char *pcStack_7a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_798;
  _Alloc_hider local_788;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  local_780;
  undefined1 local_778 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_768 [2];
  undefined1 local_758 [8];
  _Elt_pointer local_750;
  _Elt_pointer local_748;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_708 [2];
  undefined1 local_6d8 [48];
  _Alloc_hider local_6a8;
  size_type local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_698;
  _Any_data local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_678;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  undefined8 local_658;
  ValueHolder local_648;
  _Elt_pointer local_640;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_638;
  string *local_620;
  undefined1 local_618 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8;
  undefined1 local_5d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c8;
  _Base_ptr local_5b8;
  size_t local_5b0;
  string local_5a8;
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  ValueHolder local_568;
  string *local_560;
  _Elt_pointer local_558;
  ValueHolder local_550;
  _Elt_pointer local_548;
  _Map_pointer local_540;
  deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> local_538;
  _Alloc_hider local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8 [3];
  _Alloc_hider local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490 [23];
  CxxModuleUsage local_320;
  undefined1 local_2c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> vStack_288;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> local_270 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  
  pcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  local_578._0_8_ = (pcVar2->CurrentSnapshot).Position.Position;
  local_588._0_8_ = (pcVar2->CurrentSnapshot).State;
  local_588._8_8_ = (pcVar2->CurrentSnapshot).Position.Tree;
  local_7b8 = (ValueHolder *)dir_top_bld;
  local_620 = arg_dd;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_2c0,(cmStateSnapshot *)local_588);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_2c0,dir_cur_src);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_2c0,(cmStateSnapshot *)local_588);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_2c0,dir_cur_bld);
  this_00.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
  super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>)operator_new(0xdc0);
  cmMakefile::cmMakefile
            ((cmMakefile *)
             this_00.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,(cmGlobalGenerator *)this,
             (cmStateSnapshot *)local_588);
  local_2c0._0_8_ =
       this_00.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
       super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[2])
            (local_7a8,this,
             this_00.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  cmOutputConverter::SetRelativePathTop
            ((cmOutputConverter *)local_7a8,dir_top_src,(string *)local_7b8);
  std::
  vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
  ::emplace_back<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>
            ((vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
              *)&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,
             (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)local_2c0);
  std::
  vector<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>,std::allocator<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>>>
  ::emplace_back<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>>
            ((vector<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>,std::allocator<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>>>
              *)&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,
             (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)local_7a8);
  local_7b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)this;
  if (local_7a8 != (undefined1  [8])0x0) {
    (**(code **)(*(size_type *)local_7a8 + 8))();
  }
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)local_2c0);
  local_668._M_allocated_capacity = 0;
  local_668._8_8_ = (cmScanDepInfo *)0x0;
  local_658 = 0;
  psVar24 = (arg_ddis->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (arg_ddis->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar24 != psVar3) {
    do {
      local_2c0._0_8_ = &local_2b0;
      local_2c0._8_8_ = (pointer)0x0;
      local_2b0._M_allocated_capacity = local_2b0._M_allocated_capacity & 0xffffffffffffff00;
      local_270[0].super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_270[0].super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_270[0].super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar16 = cmScanDepFormat_P1689_Parse(psVar24,(cmScanDepInfo *)local_2c0);
      if (bVar16) {
        std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::emplace_back<cmScanDepInfo>
                  ((vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&local_668,
                   (cmScanDepInfo *)local_2c0);
      }
      else {
        local_588._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x2f;
        local_588._8_8_ = "-E cmake_ninja_dyndep failed to parse ddi file ";
        local_578._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_568 = (ValueHolder)(psVar24->_M_dataplus)._M_p;
        local_578._8_8_ = psVar24->_M_string_length;
        local_560 = (string *)0x0;
        this = (cmGlobalNinjaGenerator *)local_7a8;
        views._M_len = 2;
        views._M_array = (iterator)local_588;
        cmCatViews((string *)this,views);
        cmSystemTools::Error((string *)this);
        if (local_7a8 != (undefined1  [8])&local_798) {
          operator_delete((void *)local_7a8,(ulong)(local_798._M_allocated_capacity + 1));
        }
      }
      std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector(local_270);
      std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::~vector(&vStack_288);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._0_8_ != &local_2b0) {
        operator_delete((void *)local_2c0._0_8_,(ulong)(local_2b0._M_allocated_capacity + 1));
      }
      if (!bVar16) {
        bVar16 = false;
        goto LAB_00459e93;
      }
      psVar24 = psVar24 + 1;
    } while (psVar24 != psVar3);
  }
  local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header;
  local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header;
  local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5c8._8_8_ = local_5d8 + 8;
  local_5d8._8_4_ = _S_red;
  local_5c8._M_allocated_capacity = 0;
  local_5b0 = 0;
  pcVar29 = (cmScanDepInfo *)
            (linked_target_dirs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_7c8 = (cmScanDepInfo *)
              (linked_target_dirs->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_5b8 = (_Base_ptr)local_5c8._8_8_;
  local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pcVar29 != local_7c8) {
    do {
      local_2c0._8_8_ = (pcVar29->PrimaryOutput)._M_dataplus._M_p;
      local_2c0._0_8_ = (pcVar29->PrimaryOutput)._M_string_length;
      local_2b0._M_allocated_capacity = 0;
      local_588._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_588._8_8_ = &DAT_00000001;
      local_578._0_8_ = local_578 + 8;
      local_578[8] = 0x2f;
      local_2b0._8_8_ = &DAT_00000001;
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(arg_lang->_M_dataplus)._M_p;
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)arg_lang->_M_string_length;
      vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0xc;
      local_270[0].super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x8d45ae;
      local_270[0].super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      views_00._M_len = 4;
      views_00._M_array = (iterator)local_2c0;
      local_7c0 = pcVar29;
      local_2a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_578._0_8_;
      cmCatViews((string *)&local_648,views_00);
      Json::Value::Value((Value *)local_828,nullValue);
      std::ifstream::ifstream(local_2c0,local_648.string_,_S_in|_S_bin);
      if ((*(byte *)((long)&local_2a0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (long)*(_Base_ptr *)(local_2c0._0_8_ - 0x18)) & 5) != 0) {
        pcVar35 = local_588;
        local_588._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x25;
        local_588._8_8_ = "-E cmake_ninja_dyndep failed to open ";
        local_578._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_578._8_8_ = local_640;
        local_568.int_ = local_648.int_;
        local_560 = (string *)0x0;
        local_558 = (_Elt_pointer)0x17;
        local_550 = (ValueHolder)0x8d45e1;
        local_548 = (_Elt_pointer)0x0;
        views_03._M_len = 3;
        views_03._M_array = (iterator)pcVar35;
        cmCatViews((string *)local_7a8,views_03);
        cmSystemTools::Error((string *)local_7a8);
        if (local_7a8 != (undefined1  [8])&local_798) {
          pcVar35 = (char *)(local_798._M_allocated_capacity + 1);
          operator_delete((void *)local_7a8,(ulong)pcVar35);
        }
        std::ifstream::~ifstream(local_2c0);
        Json::Value::~Value((Value *)local_828);
        if (local_648 != &local_638) goto LAB_00458890;
        goto LAB_00458898;
      }
      Json::Reader::Reader((Reader *)local_588);
      pcVar35 = local_2c0;
      p_Var30 = (_Link_type)0x0;
      bVar16 = Json::Reader::parse((Reader *)local_588,(istream *)pcVar35,(Value *)local_828,false);
      local_888 = (pointer)CONCAT71(local_888._1_7_,bVar16);
      if (bVar16) {
        bVar16 = Json::Value::isObject((Value *)local_828);
        if (bVar16) {
          pVVar18 = Json::Value::operator[]((Value *)local_828,"modules");
          bVar16 = Json::Value::isObject(pVVar18);
          if (bVar16) {
            cVar42 = Json::Value::begin(pVVar18);
            local_848._0_8_ = cVar42.super_ValueIteratorBase.current_._M_node;
            local_848[8] = cVar42.super_ValueIteratorBase.isNull_;
            while( true ) {
              cVar42 = Json::Value::end(pVVar18);
              local_7a8 = (undefined1  [8])cVar42.super_ValueIteratorBase.current_._M_node;
              pcStack_7a0 = (char *)CONCAT71(pcStack_7a0._1_7_,
                                             cVar42.super_ValueIteratorBase.isNull_);
              bVar16 = Json::ValueIteratorBase::isEqual
                                 ((ValueIteratorBase *)local_848,(SelfType *)local_7a8);
              if (bVar16) break;
              pVVar19 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_848);
              bVar16 = Json::Value::isObject(pVVar19);
              if (bVar16) {
                pVVar20 = Json::Value::operator[](pVVar19,"bmi");
                pVVar19 = Json::Value::operator[](pVVar19,"is-private");
                Json::Value::asString_abi_cxx11_((String *)local_7a8,pVVar20);
                bVar16 = Json::Value::asBool(pVVar19);
                local_788._M_p._0_1_ = bVar16;
                Json::ValueIteratorBase::key((Value *)&local_878,(ValueIteratorBase *)local_848);
                Json::Value::asString_abi_cxx11_((String *)&local_8b8,(Value *)&local_878);
                __position = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                             ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                               *)local_5c8._M_allocated_capacity,
                                              (_Link_type)(local_5d8 + 8),(_Base_ptr)&local_8b8,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)p_Var30);
                if (((_Link_type)__position._M_node == (_Link_type)(local_5d8 + 8)) ||
                   (iVar17 = std::__cxx11::string::compare((string *)local_8b8._M_local_buf),
                   __x = __position, iVar17 < 0)) {
                  __z = (_Link_type)operator_new(0x68);
                  puVar21 = (__z->_M_storage)._M_storage + 0x10;
                  *(uchar **)(__z->_M_storage)._M_storage = puVar21;
                  if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                       *)local_8b8._M_allocated_capacity == &local_8a8) {
                    *(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                      **)puVar21 = local_8a8._M_head_impl;
                    *(code **)((__z->_M_storage)._M_storage + 0x18) = pcStack_8a0;
                  }
                  else {
                    *(size_type *)(__z->_M_storage)._M_storage = local_8b8._M_allocated_capacity;
                    *(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                      **)puVar21 = local_8a8._M_head_impl;
                  }
                  *(undefined8 *)((__z->_M_storage)._M_storage + 8) = local_8b8._8_8_;
                  p_Var30 = (_Link_type)0x0;
                  local_8b8._8_8_ = (_Link_type)0x0;
                  local_8a8._M_head_impl =
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)((ulong)local_8a8._M_head_impl & 0xffffffffffffff00);
                  (__z->_M_storage)._M_storage[0x20] = '\0';
                  (__z->_M_storage)._M_storage[0x21] = '\0';
                  (__z->_M_storage)._M_storage[0x22] = '\0';
                  (__z->_M_storage)._M_storage[0x23] = '\0';
                  (__z->_M_storage)._M_storage[0x24] = '\0';
                  (__z->_M_storage)._M_storage[0x25] = '\0';
                  (__z->_M_storage)._M_storage[0x26] = '\0';
                  (__z->_M_storage)._M_storage[0x27] = '\0';
                  (__z->_M_storage)._M_storage[0x28] = '\0';
                  (__z->_M_storage)._M_storage[0x29] = '\0';
                  (__z->_M_storage)._M_storage[0x2a] = '\0';
                  (__z->_M_storage)._M_storage[0x2b] = '\0';
                  (__z->_M_storage)._M_storage[0x2c] = '\0';
                  (__z->_M_storage)._M_storage[0x2d] = '\0';
                  (__z->_M_storage)._M_storage[0x2e] = '\0';
                  (__z->_M_storage)._M_storage[0x2f] = '\0';
                  (__z->_M_storage)._M_storage[0x30] = '\0';
                  (__z->_M_storage)._M_storage[0x31] = '\0';
                  (__z->_M_storage)._M_storage[0x32] = '\0';
                  (__z->_M_storage)._M_storage[0x33] = '\0';
                  (__z->_M_storage)._M_storage[0x34] = '\0';
                  (__z->_M_storage)._M_storage[0x35] = '\0';
                  (__z->_M_storage)._M_storage[0x36] = '\0';
                  (__z->_M_storage)._M_storage[0x37] = '\0';
                  (__z->_M_storage)._M_storage[0x38] = '\0';
                  (__z->_M_storage)._M_storage[0x39] = '\0';
                  (__z->_M_storage)._M_storage[0x3a] = '\0';
                  (__z->_M_storage)._M_storage[0x3b] = '\0';
                  (__z->_M_storage)._M_storage[0x3c] = '\0';
                  (__z->_M_storage)._M_storage[0x3d] = '\0';
                  (__z->_M_storage)._M_storage[0x3e] = '\0';
                  (__z->_M_storage)._M_storage[0x3f] = '\0';
                  (__z->_M_storage)._M_storage[0x40] = '\0';
                  (__z->_M_storage)._M_storage[0x41] = '\0';
                  (__z->_M_storage)._M_storage[0x42] = '\0';
                  (__z->_M_storage)._M_storage[0x43] = '\0';
                  (__z->_M_storage)._M_storage[0x44] = '\0';
                  (__z->_M_storage)._M_storage[0x45] = '\0';
                  (__z->_M_storage)._M_storage[0x46] = '\0';
                  (__z->_M_storage)._M_storage[0x47] = '\0';
                  *(uchar **)((__z->_M_storage)._M_storage + 0x20) =
                       (__z->_M_storage)._M_storage + 0x30;
                  (__z->_M_storage)._M_storage[0x28] = '\0';
                  (__z->_M_storage)._M_storage[0x29] = '\0';
                  (__z->_M_storage)._M_storage[0x2a] = '\0';
                  (__z->_M_storage)._M_storage[0x2b] = '\0';
                  (__z->_M_storage)._M_storage[0x2c] = '\0';
                  (__z->_M_storage)._M_storage[0x2d] = '\0';
                  (__z->_M_storage)._M_storage[0x2e] = '\0';
                  (__z->_M_storage)._M_storage[0x2f] = '\0';
                  (__z->_M_storage)._M_storage[0x30] = '\0';
                  local_8b8._M_allocated_capacity = (size_type)&local_8a8;
                  pVar43 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                           ::_M_get_insert_hint_unique_pos
                                     ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                       *)local_5d8,(const_iterator)__position._M_node,
                                      (key_type *)&__z->_M_storage);
                  __x._M_node = pVar43.first;
                  if (pVar43.second == (_Base_ptr)0x0) {
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                    ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                    *)__z,(_Link_type)__position._M_node);
                  }
                  else {
                    p_Var30 = __z;
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                    ::_M_insert_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                      *)local_5d8,__x._M_node,pVar43.second,__z);
                    __x._M_node = (_Base_ptr)__z;
                  }
                }
                std::__cxx11::string::operator=
                          ((string *)((((_Link_type)__x._M_node)->_M_storage)._M_storage + 0x20),
                           (string *)
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_7a8)->_M_local_buf);
                (((_Link_type)__x._M_node)->_M_storage)._M_storage[0x40] = (uchar)local_788._M_p;
                if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                     *)local_8b8._M_allocated_capacity != &local_8a8) {
                  operator_delete((void *)local_8b8._M_allocated_capacity,
                                  (ulong)((long)&(local_8a8._M_head_impl)->_M_elems[0]._M_dataplus.
                                                 _M_p + 1));
                }
                Json::Value::~Value((Value *)&local_878);
                if (local_7a8 != (undefined1  [8])&local_798) {
                  operator_delete((void *)local_7a8,(ulong)(local_798._M_allocated_capacity + 1));
                }
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_848);
            }
          }
          this = (cmGlobalNinjaGenerator *)Json::Value::operator[]((Value *)local_828,"references");
          bVar16 = Json::Value::isObject((Value *)this);
          if (bVar16) {
            cVar42 = Json::Value::begin((Value *)this);
            local_848._0_8_ = cVar42.super_ValueIteratorBase.current_._M_node;
            local_848[8] = cVar42.super_ValueIteratorBase.isNull_;
            while( true ) {
              cVar42 = Json::Value::end((Value *)this);
              local_7a8 = (undefined1  [8])cVar42.super_ValueIteratorBase.current_._M_node;
              pcStack_7a0 = (char *)CONCAT71(pcStack_7a0._1_7_,
                                             cVar42.super_ValueIteratorBase.isNull_);
              bVar16 = Json::ValueIteratorBase::isEqual
                                 ((ValueIteratorBase *)local_848,(SelfType *)local_7a8);
              if (bVar16) break;
              pVVar18 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_848);
              bVar16 = Json::Value::isObject(pVVar18);
              if (bVar16) {
                pVVar18 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_848);
                pVVar18 = Json::Value::operator[](pVVar18,"path");
                local_7a8 = (undefined1  [8])&local_798;
                pcStack_7a0 = (char *)0x0;
                local_798._M_allocated_capacity =
                     local_798._M_allocated_capacity & 0xffffffffffffff00;
                bVar16 = Json::Value::isString(pVVar18);
                if (bVar16) {
                  Json::Value::asString_abi_cxx11_((String *)&local_878,pVVar18);
                  std::__cxx11::string::operator=
                            ((string *)
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_7a8)->_M_local_buf,(string *)&local_878.bool_);
                  if (local_878 != &local_868) {
                    operator_delete(local_878.string_,
                                    (ulong)((long)&(local_868._M_head_impl)->_M_elems[0]._M_dataplus
                                                   ._M_p + 1));
                  }
                }
                pVVar18 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_848);
                pVVar18 = Json::Value::operator[](pVVar18,"lookup-method");
                bVar16 = Json::Value::isString(pVVar18);
                if (bVar16) {
                  Json::Value::asString_abi_cxx11_((String *)&local_878,pVVar18);
                  iVar17 = std::__cxx11::string::compare((char *)&local_878.int_);
                  if (iVar17 == 0) {
                    local_788._M_p = local_788._M_p & 0xffffffff00000000;
                  }
                  else {
                    iVar17 = std::__cxx11::string::compare((char *)&local_878.int_);
                    if (iVar17 == 0) {
                      local_788._M_p._0_4_ = 1;
                    }
                    else {
                      iVar17 = std::__cxx11::string::compare((char *)&local_878.int_);
                      if (iVar17 == 0) {
                        local_788._M_p._0_4_ = 2;
                      }
                    }
                  }
                  if (local_878 != &local_868) {
                    operator_delete(local_878.string_,
                                    (ulong)((long)&(local_868._M_head_impl)->_M_elems[0]._M_dataplus
                                                   ._M_p + 1));
                  }
                }
                Json::ValueIteratorBase::key((Value *)&local_878,(ValueIteratorBase *)local_848);
                Json::Value::asString_abi_cxx11_((String *)&local_8b8,(Value *)&local_878);
                pmVar22 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
                          ::operator[](&local_320.Reference,(key_type *)&local_8b8);
                std::__cxx11::string::_M_assign((string *)pmVar22);
                pmVar22->Method = (LookupMethod)local_788._M_p;
                if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                     *)local_8b8._M_allocated_capacity != &local_8a8) {
                  operator_delete((void *)local_8b8._M_allocated_capacity,
                                  (ulong)((long)&(local_8a8._M_head_impl)->_M_elems[0]._M_dataplus.
                                                 _M_p + 1));
                }
                Json::Value::~Value((Value *)&local_878);
                if (local_7a8 != (undefined1  [8])&local_798) {
                  operator_delete((void *)local_7a8,(ulong)(local_798._M_allocated_capacity + 1));
                }
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_848);
            }
          }
          pcVar35 = "usages";
          pVVar18 = Json::Value::operator[]((Value *)local_828,"usages");
          bVar16 = Json::Value::isObject(pVVar18);
          if (bVar16) {
            cVar42 = Json::Value::begin(pVVar18);
            local_848._0_8_ = cVar42.super_ValueIteratorBase.current_._M_node;
            local_848[8] = cVar42.super_ValueIteratorBase.isNull_;
            while( true ) {
              cVar42 = Json::Value::end(pVVar18);
              local_7a8 = (undefined1  [8])cVar42.super_ValueIteratorBase.current_._M_node;
              pcStack_7a0 = (char *)CONCAT71(pcStack_7a0._1_7_,
                                             cVar42.super_ValueIteratorBase.isNull_);
              pcVar35 = (char *)local_7a8;
              bVar16 = Json::ValueIteratorBase::isEqual
                                 ((ValueIteratorBase *)local_848,(SelfType *)local_7a8);
              if (bVar16) break;
              pVVar19 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_848);
              bVar16 = Json::Value::isArray(pVVar19);
              if (bVar16) {
                pVVar19 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_848);
                cVar42 = Json::Value::begin(pVVar19);
                local_688._M_unused._0_8_ =
                     (undefined8)cVar42.super_ValueIteratorBase.current_._M_node;
                local_688._M_pod_data[8] = cVar42.super_ValueIteratorBase.isNull_;
                while( true ) {
                  pVVar19 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_848);
                  cVar42 = Json::Value::end(pVVar19);
                  local_7a8 = (undefined1  [8])cVar42.super_ValueIteratorBase.current_._M_node;
                  pcStack_7a0 = (char *)CONCAT71(pcStack_7a0._1_7_,
                                                 cVar42.super_ValueIteratorBase.isNull_);
                  bVar16 = Json::ValueIteratorBase::isEqual
                                     ((ValueIteratorBase *)&local_688,(SelfType *)local_7a8);
                  if (bVar16) break;
                  Json::ValueIteratorBase::key((Value *)local_7a8,(ValueIteratorBase *)local_848);
                  Json::Value::asString_abi_cxx11_((String *)&local_878,(Value *)local_7a8);
                  this_01 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               ::operator[](&local_320.Usage,(key_type *)&local_878);
                  pVVar19 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&local_688);
                  this = (cmGlobalNinjaGenerator *)&local_8b8;
                  Json::Value::asString_abi_cxx11_((String *)this,pVVar19);
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)this);
                  if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                       *)local_8b8._M_allocated_capacity != &local_8a8) {
                    operator_delete((void *)local_8b8._M_allocated_capacity,
                                    (ulong)((long)&(local_8a8._M_head_impl)->_M_elems[0]._M_dataplus
                                                   ._M_p + 1));
                  }
                  if (local_878 != &local_868) {
                    operator_delete(local_878.string_,
                                    (ulong)((long)&(local_868._M_head_impl)->_M_elems[0]._M_dataplus
                                                   ._M_p + 1));
                  }
                  Json::Value::~Value((Value *)local_7a8);
                  Json::ValueIteratorBase::increment((ValueIteratorBase *)&local_688);
                }
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_848);
            }
          }
        }
      }
      else {
        Json::Reader::getFormattedErrorMessages_abi_cxx11_((String *)&local_8b8,(Reader *)local_588)
        ;
        local_7a8 = (undefined1  [8])0x26;
        pcStack_7a0 = "-E cmake_ninja_dyndep failed to parse ";
        local_798._M_allocated_capacity = 0;
        local_788._M_p = (local_7c0->PrimaryOutput)._M_dataplus._M_p;
        local_798._8_8_ = (local_7c0->PrimaryOutput)._M_string_length;
        local_780._M_head_impl =
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)0x0;
        local_778._0_8_ = local_8b8._8_8_;
        local_778._8_8_ = local_8b8._M_allocated_capacity;
        views_01._M_len = 3;
        views_01._M_array = (iterator)local_7a8;
        pcVar35 = (char *)local_7a8;
        local_768[0] = &local_8b8;
        cmCatViews((string *)&local_878,views_01);
        cmSystemTools::Error((string *)&local_878);
        if (local_878 != &local_868) {
          pcVar35 = (char *)((long)&(local_868._M_head_impl)->_M_elems[0]._M_dataplus._M_p + 1);
          operator_delete(local_878.string_,(ulong)pcVar35);
        }
        if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
             *)local_8b8._M_allocated_capacity != &local_8a8) {
          pcVar35 = (char *)((long)&(local_8a8._M_head_impl)->_M_elems[0]._M_dataplus._M_p + 1);
          operator_delete((void *)local_8b8._M_allocated_capacity,(ulong)pcVar35);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_p != local_490) {
        pcVar35 = (char *)(local_490[0]._M_allocated_capacity + 1);
        operator_delete(local_4a0._M_p,(ulong)pcVar35);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_p != local_4d8) {
        pcVar35 = (char *)(local_4d8[0]._M_allocated_capacity + 1);
        operator_delete(local_4e8._M_p,(ulong)pcVar35);
      }
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                (&local_538);
      std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_588);
      std::ifstream::~ifstream(local_2c0);
      Json::Value::~Value((Value *)local_828);
      if (local_648 != &local_638) {
        pcVar35 = (char *)(local_638._M_allocated_capacity + 1);
        operator_delete(local_648.string_,(ulong)pcVar35);
      }
      if ((char)local_888 == '\0') goto LAB_00458898;
      pcVar29 = (cmScanDepInfo *)&local_7c0->ExtraOutputs;
    } while (pcVar29 != local_7c8);
  }
  local_87c = Clang;
  if (arg_modmapfmt->_M_string_length == 0) {
    uVar34 = 0;
  }
  else {
    iVar17 = std::__cxx11::string::compare((char *)arg_modmapfmt);
    uVar34 = CONCAT71((int7)((ulong)this >> 8),1);
    if (iVar17 != 0) {
      iVar17 = std::__cxx11::string::compare((char *)arg_modmapfmt);
      if (iVar17 == 0) {
        local_87c = Gcc;
      }
      else {
        iVar17 = std::__cxx11::string::compare((char *)arg_modmapfmt);
        if (iVar17 != 0) {
          pcVar35 = local_2c0;
          local_2c0._0_8_ = (__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>)0x2e;
          local_2c0._8_8_ = "-E cmake_ninja_dyndep does not understand the ";
          local_2b0._M_allocated_capacity = 0;
          local_2a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(arg_modmapfmt->_M_dataplus)._M_p;
          local_2b0._8_8_ = arg_modmapfmt->_M_string_length;
          local_2a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x12;
          vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x8d4698;
          vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          views_02._M_len = 3;
          views_02._M_array = (iterator)pcVar35;
          cmCatViews((string *)local_588,views_02);
          cmSystemTools::Error((string *)local_588);
          local_638._M_allocated_capacity = local_578._0_8_;
          local_648 = (ValueHolder)local_588._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578) {
LAB_00458890:
            pcVar35 = (char *)(local_638._M_allocated_capacity + 1);
            operator_delete(local_648.string_,(ulong)pcVar35);
          }
LAB_00458898:
          bVar16 = false;
          goto LAB_00459e6c;
        }
        local_87c = Msvc;
      }
    }
  }
  sVar44 = CxxModuleMapExtension
                     ((optional<CxxModuleMapFormat>)((ulong)local_87c | (uVar34 & 0xff) << 0x20));
  local_888 = (pointer)sVar44.super_string_view._M_str;
  local_7c8 = (cmScanDepInfo *)CONCAT44(local_7c8._4_4_,(int)uVar34);
  Json::Value::Value((Value *)&local_648,objectValue);
  local_7c0 = (cmScanDepInfo *)local_668._8_8_;
  if (local_668._M_allocated_capacity != local_668._8_8_) {
    uVar33 = local_668._M_allocated_capacity;
    do {
      pcVar4 = (((cmScanDepInfo *)uVar33)->Provides).
               super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar40 = (((cmScanDepInfo *)uVar33)->Provides).
                     super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                     super__Vector_impl_data._M_start; pcVar40 != pcVar4; pcVar40 = pcVar40 + 1) {
        local_588._0_8_ = local_578;
        local_588._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_578._0_8_ = local_578._0_8_ & 0xffffffffffffff00;
        bVar16 = cmDyndepCollation::IsBmiOnly(export_info,(string *)uVar33);
        if (bVar16) {
          std::__cxx11::string::_M_assign((string *)local_588);
        }
        else if ((pcVar40->CompiledModulePath)._M_string_length == 0) {
          local_7a8 = (undefined1  [8])&local_798;
          pcVar5 = (pcVar40->LogicalName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_7a8,pcVar5,pcVar5 + (pcVar40->LogicalName)._M_string_length);
          cmsys::SystemTools::ReplaceString((string *)local_7a8,":","-");
          local_2c0._8_8_ = (module_dir->_M_dataplus)._M_p;
          local_2c0._0_8_ = module_dir->_M_string_length;
          local_2b0._M_allocated_capacity = 0;
          local_2b0._8_8_ = pcStack_7a0;
          local_2a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_7a8;
          local_2a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_start = local_888;
          vStack_288.super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          views_04._M_len = 3;
          views_04._M_array = (iterator)local_2c0;
          local_2a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)sVar44.super_string_view._M_len;
          cmCatViews((string *)local_828,views_04);
          std::__cxx11::string::operator=((string *)local_588,(string *)local_828);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_828._0_8_ != &local_818) {
            operator_delete((void *)local_828._0_8_,(ulong)(local_818._M_allocated_capacity + 1));
          }
          uVar36 = local_798._M_allocated_capacity;
          _Var38._M_head_impl = (cmMakefile *)local_7a8;
          if (local_7a8 != (undefined1  [8])&local_798) {
LAB_00458af1:
            operator_delete(_Var38._M_head_impl,(ulong)((long)&((ObjectValues *)uVar36)->_M_t + 1));
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)local_588);
          bVar16 = cmsys::SystemTools::FileIsFullPath((string *)local_588);
          if (!bVar16) {
            cmsys::SystemTools::CollapseFullPath
                      ((string *)local_2c0,(string *)local_588,(string *)local_7b8);
            std::__cxx11::string::operator=((string *)local_588,(string *)local_2c0);
            uVar36 = local_2b0._M_allocated_capacity;
            _Var38._M_head_impl = (cmMakefile *)local_2c0._0_8_;
            if ((cmMakefile *)local_2c0._0_8_ != (cmMakefile *)&local_2b0) goto LAB_00458af1;
          }
        }
        local_2c0._0_8_ = &local_2b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2c0,local_588._0_8_,(pointer)(local_588._8_8_ + local_588._0_8_))
        ;
        local_2a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)local_2a0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        pmVar23 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                *)local_5d8,&pcVar40->LogicalName);
        std::__cxx11::string::operator=((string *)pmVar23,(string *)local_2c0);
        pmVar23->IsPrivate =
             local_2a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._0_8_ != &local_2b0) {
          operator_delete((void *)local_2c0._0_8_,(ulong)(local_2b0._M_allocated_capacity + 1));
        }
        Json::Value::Value((Value *)local_2c0,objectValue);
        pVVar18 = Json::Value::operator[]((Value *)&local_648,&pcVar40->LogicalName);
        pVVar18 = Json::Value::operator=(pVVar18,(Value *)local_2c0);
        Json::Value::~Value((Value *)local_2c0);
        Json::Value::Value((Value *)local_2c0,(string *)local_588);
        pVVar19 = Json::Value::operator[](pVVar18,"bmi");
        Json::Value::operator=(pVVar19,(Value *)local_2c0);
        Json::Value::~Value((Value *)local_2c0);
        bVar16 = cmDyndepCollation::IsObjectPrivate((string *)uVar33,export_info);
        Json::Value::Value((Value *)local_2c0,bVar16);
        pVVar18 = Json::Value::operator[](pVVar18,"is-private");
        Json::Value::operator=(pVVar18,(Value *)local_2c0);
        Json::Value::~Value((Value *)local_2c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578) {
          operator_delete((void *)local_588._0_8_,(ulong)(local_578._0_8_ + 1));
        }
      }
      uVar33 = uVar33 + 0x68;
    } while ((cmScanDepInfo *)uVar33 != local_7c0);
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2c0,local_620,false,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c0,"ninja_dyndep_version = 1.0\n",0x1b);
  paVar37 = local_7b0;
  local_828._0_8_ = &local_818;
  local_828._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_818._M_allocated_capacity = local_818._M_allocated_capacity & 0xffffffffffffff00;
  local_808._M_allocated_capacity = 0;
  local_808._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  local_7f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  ppVStack_7f0 = (_Elt_pointer)0x0;
  local_7e8._M_allocated_capacity = 0;
  local_7e8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_7d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  ppVStack_7d0 = (_Elt_pointer)0x0;
  cb = (_Any_data *)&DAT_00000001;
  std::__cxx11::string::_M_replace((ulong)local_828,0,(char *)0x0,0x8a5422);
  pcVar29 = local_7c8;
  pbVar9 = local_7f8;
  local_7a8 = (undefined1  [8])paVar37;
  pcStack_7a0 = (char *)0x0;
  local_588._0_8_ = local_808._M_allocated_capacity;
  local_588._8_8_ = local_808._8_8_;
  local_808._M_allocated_capacity = (size_type)paVar37;
  local_808._8_8_ = 0;
  local_578._0_8_ = local_7f8;
  local_7f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2737:29)>
              ::_M_manager;
  local_578._8_8_ = ppVStack_7f0;
  ppVStack_7f0 = (_Elt_pointer)
                 std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2737:29)>
                 ::_M_invoke;
  if (pbVar9 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (*(code *)pbVar9)(local_588,local_588,3);
  }
  paVar10 = local_7d8;
  local_588._0_8_ = local_7e8._M_allocated_capacity;
  local_588._8_8_ = local_7e8._8_8_;
  local_7e8._8_8_ = 0;
  local_578._0_8_ = local_7d8;
  local_7d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::
                 _Function_handler<CxxBmiLocation_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2747:7)>
                 ::_M_manager;
  local_578._8_8_ = ppVStack_7d0;
  ppVStack_7d0 = (_Elt_pointer)
                 std::
                 _Function_handler<CxxBmiLocation_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2747:7)>
                 ::_M_invoke;
  local_7e8._M_allocated_capacity = (size_type)(String *)local_5d8;
  if (paVar10 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (*(code *)paVar10)(local_588,local_588,3);
  }
  if ((char)pcVar29 == '\0') {
LAB_00458fd5:
    local_5f8._M_allocated_capacity = (size_type)&local_5e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"dyndep","");
    local_7a8 = (undefined1  [8])&local_798;
    pcStack_7a0 = (char *)0x0;
    local_798._M_allocated_capacity = local_798._M_allocated_capacity & 0xffffffffffffff00;
    local_788._M_p = local_778;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._0_8_ == &local_5e8) {
      local_778._8_8_ = local_5e8._8_8_;
    }
    else {
      local_788._M_p = (pointer)local_5f8._0_8_;
    }
    local_778._1_7_ = local_5e8._M_allocated_capacity._1_7_;
    local_778[0] = local_5e8._M_local_buf[0];
    local_780._M_head_impl =
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)local_5f8._8_8_;
    local_5f8._8_8_ =
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)0x0;
    local_5e8._M_local_buf[0] = '\0';
    local_6d8._8_4_ = _S_red;
    local_6d8._16_8_ = (_Base_ptr)0x0;
    local_5f8._M_allocated_capacity = (size_type)&local_5e8;
    memset((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_768,0,0x90);
    local_6d8._40_8_ = 0;
    local_6a8._M_p = (pointer)&local_698;
    local_6a0 = 0;
    local_698._M_local_buf[0] = '\0';
    local_6d8._24_8_ = (_Base_ptr)(local_6d8 + 8);
    local_6d8._32_8_ = (_Base_ptr)(local_6d8 + 8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[1]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_768,
               (char (*) [1])0x91dca5);
    local_888 = (pointer)local_668._8_8_;
    if (local_668._M_allocated_capacity != local_668._8_8_) {
      uVar33 = local_668._M_allocated_capacity;
      do {
        ConvertToNinjaPath((cmGlobalNinjaGenerator *)paVar37,(string *)uVar33);
        std::__cxx11::string::_M_assign((string *)local_768[0]->_M_local_buf);
        pEVar12 = local_748;
        pEVar11 = local_750;
        if (local_748 != local_750) {
          paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_750->token_).end_;
          do {
            if (paVar37 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar37->_M_allocated_capacity)[-2]) {
              operator_delete((long *)(&paVar37->_M_allocated_capacity)[-2],
                              paVar37->_M_allocated_capacity + 1);
            }
            pEVar39 = (_Elt_pointer)(&paVar37->_M_allocated_capacity + 2);
            paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar37->_M_allocated_capacity + 4);
          } while (pEVar39 != pEVar12);
          local_748 = pEVar11;
          paVar37 = local_7b0;
        }
        pcVar4 = (((cmScanDepInfo *)uVar33)->Provides).
                 super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pcVar40 = (((cmScanDepInfo *)uVar33)->Provides).
                       super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl
                       .super__Vector_impl_data._M_start;
            pbVar14 = local_708[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            pbVar13 = local_708[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, pcVar40 != pcVar4;
            pcVar40 = pcVar40 + 1) {
          pmVar23 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                  *)local_5d8,&pcVar40->LogicalName);
          psVar24 = ConvertToNinjaPath((cmGlobalNinjaGenerator *)paVar37,&pmVar23->BmiPath);
          pcVar5 = (psVar24->_M_dataplus)._M_p;
          local_588._0_8_ = local_578;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_588,pcVar5,pcVar5 + psVar24->_M_string_length);
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_588._8_8_ !=
               *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)(local_768[0]->_M_local_buf + 8)) ||
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_588._8_8_ !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0 &&
              (iVar17 = bcmp((void *)local_588._0_8_,(void *)local_768[0]->_M_allocated_capacity,
                             local_588._8_8_), iVar17 != 0)))) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_750,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_588);
          }
          if ((undefined1 *)local_588._0_8_ != local_578) {
            operator_delete((void *)local_588._0_8_,(ulong)(local_578._0_8_ + 1));
          }
        }
        if (local_708[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_708[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar37 = &(local_708[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            if (paVar37 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar37->_M_allocated_capacity)[-2]) {
              operator_delete((long *)(&paVar37->_M_allocated_capacity)[-2],
                              paVar37->_M_allocated_capacity + 1);
            }
            psVar7 = &paVar37->_M_allocated_capacity + 2;
            paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar37->_M_allocated_capacity + 4);
          } while ((pointer)psVar7 != pbVar14);
          local_708[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar13;
          paVar37 = local_7b0;
        }
        pcVar4 = (((cmScanDepInfo *)uVar33)->Requires).
                 super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pcVar40 = (((cmScanDepInfo *)uVar33)->Requires).
                       super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl
                       .super__Vector_impl_data._M_start; pcVar40 != pcVar4; pcVar40 = pcVar40 + 1)
        {
          iVar25 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                           *)local_5d8,&pcVar40->LogicalName);
          if (iVar25._M_node != (_Base_ptr)(local_5d8 + 8)) {
            psVar24 = ConvertToNinjaPath((cmGlobalNinjaGenerator *)paVar37,
                                         (string *)(iVar25._M_node + 2));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_708,psVar24);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_6d8);
        pcVar29 = local_7c8;
        if ((((cmScanDepInfo *)uVar33)->Provides).
            super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (((cmScanDepInfo *)uVar33)->Provides).
            super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<char_const(&)[7],char_const(&)[2]>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)local_6d8,(char (*) [7])"restat",(char (*) [2])0x92ff58);
        }
        if ((char)pcVar29 != '\0') {
          CxxModuleMapContent_abi_cxx11_
                    ((string *)&local_8b8,local_87c,(CxxModuleLocations *)local_828,
                     (cmScanDepInfo *)uVar33,&local_320);
          local_870 = (((cmScanDepInfo *)uVar33)->PrimaryOutput)._M_dataplus._M_p;
          local_878 = (ValueHolder)(((cmScanDepInfo *)uVar33)->PrimaryOutput)._M_string_length;
          local_868._M_head_impl =
               (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                *)0x0;
          local_860 = 7;
          local_858 = ".modmap";
          local_850 = 0;
          views_06._M_len = 2;
          views_06._M_array = (iterator)&local_878;
          cmCatViews((string *)local_848,views_06);
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)local_588,(string *)local_848,false,None);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_848._0_8_ != &local_838) {
            operator_delete((void *)local_848._0_8_,local_838._M_allocated_capacity + 1);
          }
          cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_588,true);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_588,(char *)local_8b8._M_allocated_capacity,local_8b8._8_8_);
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_588);
          if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
               *)local_8b8._M_allocated_capacity != &local_8a8) {
            operator_delete((void *)local_8b8._M_allocated_capacity,
                            (ulong)((long)&(local_8a8._M_head_impl)->_M_elems[0]._M_dataplus._M_p +
                                   1));
          }
        }
        cb = (_Any_data *)0x0;
        WriteBuild((cmGlobalNinjaGenerator *)paVar37,(ostream *)local_2c0,(cmNinjaBuild *)local_7a8,
                   0,(bool *)0x0);
        uVar33 = uVar33 + 0x68;
      } while ((pointer)uVar33 != local_888);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_7a8);
    if (local_7d8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (*(code *)local_7d8)((_Any_data *)&local_7e8,(_Any_data *)&local_7e8,__destroy_functor);
    }
    if (local_7f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)local_7f8)((_Any_data *)&local_808,(_Any_data *)&local_808,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_828._0_8_ != &local_818) {
      operator_delete((void *)local_828._0_8_,(ulong)(local_818._M_allocated_capacity + 1));
    }
    Json::Value::Value((Value *)&local_878,objectValue);
    pVVar18 = Json::Value::operator[]((Value *)&local_878,"modules");
    Json::Value::operator=(pVVar18,(Value *)&local_648);
    Json::Value::Value((Value *)local_588,objectValue);
    pVVar18 = Json::Value::operator[]((Value *)&local_878,"usages");
    local_888 = (pointer)Json::Value::operator=(pVVar18,(Value *)local_588);
    Json::Value::~Value((Value *)local_588);
    if ((_Rb_tree_header *)local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_320.Usage._M_t._M_impl.super__Rb_tree_header) {
      p_Var27 = local_320.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        Json::Value::Value((Value *)local_588,arrayValue);
        pVVar18 = Json::Value::operator[]((Value *)local_888,(String *)(p_Var27 + 1));
        pVVar18 = Json::Value::operator=(pVVar18,(Value *)local_588);
        Json::Value::~Value((Value *)local_588);
        for (p_Var26 = p_Var27[2]._M_right; p_Var26 != (_Rb_tree_node_base *)&p_Var27[2]._M_parent;
            p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26)) {
          Json::Value::Value((Value *)local_588,(String *)(p_Var26 + 1));
          Json::Value::append(pVVar18,(Value *)local_588);
          Json::Value::~Value((Value *)local_588);
        }
        p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27);
      } while ((_Rb_tree_header *)p_Var27 != &local_320.Usage._M_t._M_impl.super__Rb_tree_header);
    }
    Json::Value::Value((Value *)local_588,objectValue);
    pVVar18 = Json::Value::operator[]((Value *)&local_878,"references");
    pVVar18 = Json::Value::operator=(pVVar18,(Value *)local_588);
    Json::Value::~Value((Value *)local_588);
    if ((_Rb_tree_header *)local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        != &local_320.Reference._M_t._M_impl.super__Rb_tree_header) {
      p_Var27 = local_320.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        Json::Value::Value((Value *)local_588,objectValue);
        pVVar19 = Json::Value::operator[](pVVar18,(String *)(p_Var27 + 1));
        pVVar19 = Json::Value::operator=(pVVar19,(Value *)local_588);
        Json::Value::~Value((Value *)local_588);
        Json::Value::Value((Value *)local_588,(String *)(p_Var27 + 2));
        pVVar20 = Json::Value::operator[](pVVar19,"path");
        Json::Value::operator=(pVVar20,(Value *)local_588);
        Json::Value::~Value((Value *)local_588);
        _Var1 = p_Var27[3]._M_color;
        if (_Var1 == _S_red) {
          lVar32 = 7;
          pcVar35 = "by-name";
        }
        else if (_Var1 == 2) {
          lVar32 = 0xd;
          pcVar35 = "include-quote";
        }
        else {
          if (_Var1 != _S_black) {
            __assert_fail("false && \"unsupported lookup method\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx"
                          ,0xb16,
                          "auto cmGlobalNinjaGenerator::WriteDyndepFile(const std::string &, const std::string &, const std::string &, const std::string &, const std::string &, const std::vector<std::string> &, const std::string &, const std::vector<std::string> &, const std::vector<std::string> &, const std::string &, const std::string &, const cmCxxModuleExportInfo &)::(anonymous class)::operator()(LookupMethod) const"
                         );
          }
          lVar32 = 0xd;
          pcVar35 = "include-angle";
        }
        local_7a8 = (undefined1  [8])&local_798;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_7a8,pcVar35,pcVar35 + lVar32);
        Json::Value::Value((Value *)local_588,(String *)local_7a8);
        pVVar19 = Json::Value::operator[](pVVar19,"lookup-method");
        Json::Value::operator=(pVVar19,(Value *)local_588);
        Json::Value::~Value((Value *)local_588);
        if (local_7a8 != (undefined1  [8])&local_798) {
          operator_delete((void *)local_7a8,local_798._M_allocated_capacity + 1);
        }
        p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27);
      } while ((_Rb_tree_header *)p_Var27 != &local_320.Reference._M_t._M_impl.super__Rb_tree_header
              );
    }
    cmsys::SystemTools::GetFilenamePath((string *)local_828,local_620);
    local_588._0_8_ = local_828._8_8_;
    local_588._8_8_ = local_828._0_8_;
    local_798._M_allocated_capacity = (size_type)(local_798._M_local_buf + 8);
    local_7a8 = (undefined1  [8])0x0;
    pcStack_7a0 = &DAT_00000001;
    local_798._M_local_buf[8] = 0x2f;
    local_578._8_8_ = &DAT_00000001;
    local_560 = (string *)0x0;
    local_550 = (ValueHolder)(arg_lang->_M_dataplus)._M_p;
    local_558 = (_Elt_pointer)arg_lang->_M_string_length;
    local_548 = (_Elt_pointer)0x0;
    local_540 = (_Map_pointer)0xc;
    local_538.super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
    _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x8d45ae;
    local_538.super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>.
    _M_impl.super__Deque_impl_data._M_map_size = 0;
    views_07._M_len = 4;
    views_07._M_array = (iterator)local_588;
    local_578._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_828;
    local_568.string_ = (char *)local_798._M_allocated_capacity;
    cmCatViews((string *)local_848,views_07);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_828._0_8_ != &local_818) {
      operator_delete((void *)local_828._0_8_,(ulong)(local_818._M_allocated_capacity + 1));
    }
    pVVar41 = (ValueHolder *)
              (forward_modules_from_target_dirs->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_7b8 = (ValueHolder *)
                (forward_modules_from_target_dirs->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (pVVar41 != local_7b8) {
      do {
        paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7a8;
        local_588._8_8_ = *pVVar41;
        local_588._0_8_ = pVVar41[1].int_;
        local_578._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_7a8 = (undefined1  [8])0x0;
        pcStack_7a0 = &DAT_00000001;
        local_798._M_allocated_capacity = (size_type)(local_798._M_local_buf + 8);
        local_798._M_local_buf[8] = 0x2f;
        local_578._8_8_ = &DAT_00000001;
        local_560 = (string *)0x0;
        local_550 = (ValueHolder)(arg_lang->_M_dataplus)._M_p;
        local_558 = (_Elt_pointer)arg_lang->_M_string_length;
        local_548 = (_Elt_pointer)0x0;
        local_540 = (_Map_pointer)0xc;
        local_538.
        super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl
        .super__Deque_impl_data._M_map = (_Map_pointer)0x8d45ae;
        local_538.
        super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl
        .super__Deque_impl_data._M_map_size = 0;
        views_08._M_len = 4;
        views_08._M_array = (iterator)local_588;
        local_568.string_ = (char *)local_798._M_allocated_capacity;
        cmCatViews((string *)&local_688,views_08);
        Json::Value::Value((Value *)&local_8b8,nullValue);
        std::ifstream::ifstream
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_588,(char *)local_688._M_unused._0_8_,_S_in|_S_bin);
        if (((&local_568.bool_)[*(size_type *)(local_588._0_8_ - 0x18)] & 5U) == 0) {
          Json::Reader::Reader((Reader *)paVar37);
          pcVar35 = (char *)local_588;
          bVar16 = Json::Reader::parse((Reader *)paVar37,(istream *)local_588,(Value *)&local_8b8,
                                       false);
          if (bVar16) {
            bVar16 = Json::Value::isObject((Value *)&local_8b8);
            iVar17 = 0x23;
            if (bVar16) {
              pVVar19 = Json::Value::operator[]((Value *)&local_878,"modules");
              pVVar20 = Json::Value::operator[]((Value *)&local_8b8,"modules");
              WriteDyndepFile::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)pVVar19,pVVar20,source);
              pVVar19 = Json::Value::operator[]((Value *)&local_8b8,"references");
              WriteDyndepFile::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)pVVar18,pVVar19,source_00);
              pcVar35 = (char *)Json::Value::operator[]((Value *)&local_8b8,"usages");
              iVar17 = 0;
              WriteDyndepFile::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)local_888,(Value *)pcVar35,source_01);
            }
          }
          else {
            Json::Reader::getFormattedErrorMessages_abi_cxx11_
                      ((String *)local_618,(Reader *)paVar37);
            local_828._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x26;
            local_828._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
            local_818._M_allocated_capacity = 0;
            local_808._M_allocated_capacity = (size_type)*pVVar41;
            local_818._8_8_ = pVVar41[1];
            local_808._8_8_ = 0;
            local_7f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_618._8_8_;
            ppVStack_7f0 = (_Elt_pointer)local_618._0_8_;
            pcVar35 = local_828;
            views_10._M_len = 3;
            views_10._M_array = (iterator)pcVar35;
            local_7e8._M_allocated_capacity = (size_type)(String *)local_618;
            cmCatViews(&local_5a8,views_10);
            cmSystemTools::Error(&local_5a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
              pcVar35 = (char *)(local_5a8.field_2._M_allocated_capacity + 1);
              operator_delete(local_5a8._M_dataplus._M_p,(ulong)pcVar35);
            }
            if ((undefined1 *)local_618._0_8_ != local_618 + 0x10) {
              pcVar35 = (char *)(local_608._M_allocated_capacity + 1);
              operator_delete((void *)local_618._0_8_,(ulong)pcVar35);
            }
            iVar17 = 1;
          }
          if ((_Base_ptr)local_6d8._24_8_ != (_Base_ptr)(local_6d8 + 0x28)) {
            pcVar35 = (char *)(local_6d8._40_8_ + 1);
            operator_delete((void *)local_6d8._24_8_,(ulong)pcVar35);
          }
          if (local_708[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&local_708[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pcVar35 = (char *)((long)&((local_708[0].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                      _M_dataplus)._M_p + 1);
            operator_delete(local_708[0].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,(ulong)pcVar35);
          }
          std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                    ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                     local_758);
          std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                    ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_7a8);
        }
        else {
          local_7a8 = (undefined1  [8])0x25;
          pcStack_7a0 = "-E cmake_ninja_dyndep failed to open ";
          local_798._M_allocated_capacity = 0;
          local_798._8_8_ = CONCAT71(local_688._9_7_,local_688._M_pod_data[8]);
          local_788._M_p = (pointer)local_688._M_unused._0_8_;
          local_780._M_head_impl =
               (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                *)0x0;
          local_778._0_8_ = (_Link_type)0x17;
          local_778._8_8_ = " for module information";
          local_768[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
          views_09._M_len = 3;
          views_09._M_array = (iterator)paVar37;
          cmCatViews((string *)local_828,views_09);
          cmSystemTools::Error((string *)local_828);
          pcVar35 = (char *)paVar37;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_828._0_8_ != &local_818) {
            pcVar35 = (char *)(local_818._M_allocated_capacity + 1);
            operator_delete((void *)local_828._0_8_,(ulong)pcVar35);
          }
          iVar17 = 1;
        }
        std::ifstream::~ifstream
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_588);
        Json::Value::~Value((Value *)&local_8b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688._M_unused._0_8_ != &local_678) {
          pcVar35 = (char *)(local_678._M_allocated_capacity + 1);
          operator_delete(local_688._M_unused._M_object,(ulong)pcVar35);
        }
        if ((iVar17 != 0x23) && (iVar17 != 0)) {
          bVar16 = false;
          goto LAB_00459e27;
        }
        pVVar41 = pVVar41 + 4;
      } while (pVVar41 != local_7b8);
    }
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_588,(string *)local_848,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_588,true);
    Json::operator<<((OStream *)local_588,(Value *)&local_878);
    local_8a8._M_head_impl =
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)0x0;
    pcStack_8a0 = (code *)0x0;
    local_8b8._M_allocated_capacity = 0;
    local_8b8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
           *)local_7a8,
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
           *)local_5d8);
    local_818._M_allocated_capacity = 0;
    local_818._8_8_ = 0;
    local_828._0_8_ = 0;
    local_828._8_8_ = (_Link_type)0x0;
    p_Var28 = (_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
               *)operator_new(0x30);
    _Var8._M_head_impl = local_8a8._M_head_impl;
    p_Var31 = p_Var28 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_allocated_capacity ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      *(undefined4 *)&p_Var28[1]._M_head_impl = 0;
      p_Var28[2]._M_head_impl =
           (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
            *)0x0;
      p_Var28[3]._M_head_impl =
           (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
            *)p_Var31;
      p_Var28[4]._M_head_impl =
           (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
            *)p_Var31;
      p_Var31 = p_Var28 + 5;
    }
    else {
      *(undefined4 *)&p_Var28[1]._M_head_impl = pcStack_7a0._0_4_;
      p_Var28[2]._M_head_impl =
           (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
            *)local_798._M_allocated_capacity;
      p_Var28[3]._M_head_impl =
           (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
            *)local_798._8_8_;
      p_Var28[4]._M_head_impl =
           (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
            *)local_788._M_p;
      *(_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        **)&((_Rb_tree_header *)(local_798._M_allocated_capacity + 8))->_M_header = p_Var31;
      p_Var31 = &local_780;
      p_Var28[5]._M_head_impl = local_780._M_head_impl;
      local_798._M_allocated_capacity = 0;
      local_798._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&pcStack_7a0;
      local_788._M_p = (pointer)&pcStack_7a0;
    }
    p_Var31->_M_head_impl =
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)0x0;
    local_828._0_8_ = local_8b8._M_allocated_capacity;
    VVar6.int_ = local_8b8._8_8_;
    local_8b8._8_8_ = local_828._8_8_;
    local_818._M_allocated_capacity = (size_type)local_8a8._M_head_impl;
    local_8a8._M_head_impl =
         (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *)std::
            _Function_handler<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2905:5)>
            ::_M_manager;
    local_818._8_8_ = pcStack_8a0;
    pcStack_8a0 = std::
                  _Function_handler<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2905:5)>
                  ::_M_invoke;
    p_Var30 = (_Link_type)local_828._8_8_;
    local_8b8._M_allocated_capacity = (size_type)p_Var28;
    local_828._8_8_ = VVar6.int_;
    if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
         )_Var8._M_head_impl !=
        (_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
         )0x0) {
      p_Var30 = (_Link_type)local_828;
      (*(code *)_Var8._M_head_impl)(p_Var30,p_Var30,3);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                *)local_798._M_allocated_capacity,p_Var30);
    pcVar35 = (char *)&local_668;
    bVar16 = cmDyndepCollation::WriteDyndepMetadata
                       ((cmDyndepCollation *)arg_lang,(string *)pcVar35,
                        (vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)export_info,
                        (cmCxxModuleExportInfo *)&local_8b8,(cmDyndepMetadataCallbacks *)cb);
    if (local_8a8._M_head_impl !=
        (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
         *)0x0) {
      pcVar35 = (char *)&local_8b8;
      (*(code *)local_8a8._M_head_impl)(pcVar35,pcVar35,3);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_588);
LAB_00459e27:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_848._0_8_ != &local_838) {
      pcVar35 = (char *)(local_838._M_allocated_capacity + 1);
      operator_delete((void *)local_848._0_8_,(ulong)pcVar35);
    }
    Json::Value::~Value((Value *)&local_878);
  }
  else {
    cb = &local_688;
    local_688._M_unused._M_member_pointer =
         local_688._M_unused._M_member_pointer & 0xffffffffffffff00;
    pcVar35 = local_828;
    CxxModuleUsageSeed_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_878,(CxxModuleLocations *)pcVar35,
               (vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&local_668,&local_320,
               (bool *)cb->_M_pod_data);
    if (local_850 == 0) {
      uVar15 = local_688._M_pod_data[0];
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_878);
      if (uVar15 == '\0') goto LAB_00458fd5;
    }
    else {
      separator._M_str = "\", \"";
      separator._M_len = 4;
      cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((string *)local_848,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_878,separator);
      pcVar35 = local_588;
      local_588._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x51;
      local_588._8_8_ =
           "Circular dependency detected in the C++ module import graph. See modules named: \"";
      local_578._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_578._8_8_ = CONCAT71(local_848._9_7_,local_848[8]);
      local_568.string_ = (char *)local_848._0_8_;
      local_798._M_allocated_capacity = (size_type)(local_798._M_local_buf + 8);
      local_7a8 = (undefined1  [8])0x0;
      pcStack_7a0 = &DAT_00000001;
      local_798._M_local_buf[8] = 0x22;
      local_558 = (_Elt_pointer)&DAT_00000001;
      local_548 = (_Elt_pointer)0x0;
      views_05._M_len = 3;
      views_05._M_array = (iterator)pcVar35;
      local_560 = (string *)local_848;
      local_550.string_ = (char *)local_798._M_allocated_capacity;
      cmCatViews((string *)&local_8b8,views_05);
      cmSystemTools::Error((string *)&local_8b8);
      if ((_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
           *)local_8b8._M_allocated_capacity != &local_8a8) {
        pcVar35 = (char *)((long)&(local_8a8._M_head_impl)->_M_elems[0]._M_dataplus._M_p + 1);
        operator_delete((void *)local_8b8._M_allocated_capacity,(ulong)pcVar35);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_848._0_8_ != &local_838) {
        pcVar35 = (char *)(local_838._M_allocated_capacity + 1);
        operator_delete((void *)local_848._0_8_,(ulong)pcVar35);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_878);
    }
    if (local_7d8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar35 = (char *)&local_7e8;
      (*(code *)local_7d8)((_Any_data *)pcVar35,(_Any_data *)pcVar35,__destroy_functor);
    }
    if (local_7f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar35 = (char *)&local_808;
      (*(code *)local_7f8)((_Any_data *)pcVar35,(_Any_data *)pcVar35,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_828._0_8_ != &local_818) {
      pcVar35 = (char *)(local_818._M_allocated_capacity + 1);
      operator_delete((void *)local_828._0_8_,(ulong)pcVar35);
    }
    bVar16 = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2c0);
  Json::Value::~Value((Value *)&local_648);
LAB_00459e6c:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
              *)local_5c8._M_allocated_capacity,(_Link_type)pcVar35);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
  ::~_Rb_tree(&local_320.Reference._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)&local_320);
LAB_00459e93:
  std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::~vector
            ((vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)&local_668);
  return bVar16;
}

Assistant:

bool cmGlobalNinjaGenerator::WriteDyndepFile(
  std::string const& dir_top_src, std::string const& dir_top_bld,
  std::string const& dir_cur_src, std::string const& dir_cur_bld,
  std::string const& arg_dd, std::vector<std::string> const& arg_ddis,
  std::string const& module_dir,
  std::vector<std::string> const& linked_target_dirs,
  std::vector<std::string> const& forward_modules_from_target_dirs,
  std::string const& arg_lang, std::string const& arg_modmapfmt,
  cmCxxModuleExportInfo const& export_info)
{
  // Setup path conversions.
  {
    cmStateSnapshot snapshot = this->GetCMakeInstance()->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(dir_cur_src);
    snapshot.GetDirectory().SetCurrentBinary(dir_cur_bld);
    auto mfd = cm::make_unique<cmMakefile>(this, snapshot);
    auto lgd = this->CreateLocalGenerator(mfd.get());
    lgd->SetRelativePathTop(dir_top_src, dir_top_bld);
    this->Makefiles.push_back(std::move(mfd));
    this->LocalGenerators.push_back(std::move(lgd));
  }

  std::vector<cmScanDepInfo> objects;
  for (std::string const& arg_ddi : arg_ddis) {
    cmScanDepInfo info;
    if (!cmScanDepFormat_P1689_Parse(arg_ddi, &info)) {
      cmSystemTools::Error(
        cmStrCat("-E cmake_ninja_dyndep failed to parse ddi file ", arg_ddi));
      return false;
    }
    objects.push_back(std::move(info));
  }

  CxxModuleUsage usages;

  // Map from module name to module file path, if known.
  struct AvailableModuleInfo
  {
    std::string BmiPath;
    bool IsPrivate;
  };
  std::map<std::string, AvailableModuleInfo> mod_files;

  // Populate the module map with those provided by linked targets first.
  for (std::string const& linked_target_dir : linked_target_dirs) {
    std::string const ltmn =
      cmStrCat(linked_target_dir, '/', arg_lang, "Modules.json");
    Json::Value ltm;
    cmsys::ifstream ltmf(ltmn.c_str(), std::ios::in | std::ios::binary);
    if (!ltmf) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to open ",
                                    ltmn, " for module information"));
      return false;
    }
    Json::Reader reader;
    if (!reader.parse(ltmf, ltm, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    linked_target_dir,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
    if (ltm.isObject()) {
      Json::Value const& target_modules = ltm["modules"];
      if (target_modules.isObject()) {
        for (auto i = target_modules.begin(); i != target_modules.end(); ++i) {
          Json::Value const& visible_module = *i;
          if (visible_module.isObject()) {
            Json::Value const& bmi_path = visible_module["bmi"];
            Json::Value const& is_private = visible_module["is-private"];
            mod_files[i.key().asString()] = AvailableModuleInfo{
              bmi_path.asString(),
              is_private.asBool(),
            };
          }
        }
      }
      Json::Value const& target_modules_references = ltm["references"];
      if (target_modules_references.isObject()) {
        for (auto i = target_modules_references.begin();
             i != target_modules_references.end(); ++i) {
          if (i->isObject()) {
            Json::Value const& reference_path = (*i)["path"];
            CxxModuleReference module_reference;
            if (reference_path.isString()) {
              module_reference.Path = reference_path.asString();
            }
            Json::Value const& reference_method = (*i)["lookup-method"];
            if (reference_method.isString()) {
              std::string reference = reference_method.asString();
              if (reference == "by-name") {
                module_reference.Method = LookupMethod::ByName;
              } else if (reference == "include-angle") {
                module_reference.Method = LookupMethod::IncludeAngle;
              } else if (reference == "include-quote") {
                module_reference.Method = LookupMethod::IncludeQuote;
              }
            }
            usages.Reference[i.key().asString()] = module_reference;
          }
        }
      }
      Json::Value const& target_modules_usage = ltm["usages"];
      if (target_modules_usage.isObject()) {
        for (auto i = target_modules_usage.begin();
             i != target_modules_usage.end(); ++i) {
          if (i->isArray()) {
            for (auto j = i->begin(); j != i->end(); ++j) {
              usages.Usage[i.key().asString()].insert(j->asString());
            }
          }
        }
      }
    }
  }

  cm::optional<CxxModuleMapFormat> modmap_fmt;
  if (arg_modmapfmt.empty()) {
    // nothing to do.
  } else if (arg_modmapfmt == "clang") {
    modmap_fmt = CxxModuleMapFormat::Clang;
  } else if (arg_modmapfmt == "gcc") {
    modmap_fmt = CxxModuleMapFormat::Gcc;
  } else if (arg_modmapfmt == "msvc") {
    modmap_fmt = CxxModuleMapFormat::Msvc;
  } else {
    cmSystemTools::Error(
      cmStrCat("-E cmake_ninja_dyndep does not understand the ", arg_modmapfmt,
               " module map format"));
    return false;
  }

  auto module_ext = CxxModuleMapExtension(modmap_fmt);

  // Extend the module map with those provided by this target.
  // We do this after loading the modules provided by linked targets
  // in case we have one of the same name that must be preferred.
  Json::Value target_modules = Json::objectValue;
  for (cmScanDepInfo const& object : objects) {
    for (auto const& p : object.Provides) {
      std::string mod;
      if (cmDyndepCollation::IsBmiOnly(export_info, object.PrimaryOutput)) {
        mod = object.PrimaryOutput;
      } else if (!p.CompiledModulePath.empty()) {
        // The scanner provided the path to the module file.
        mod = p.CompiledModulePath;
        if (!cmSystemTools::FileIsFullPath(mod)) {
          // Treat relative to work directory (top of build tree).
          mod = cmSystemTools::CollapseFullPath(mod, dir_top_bld);
        }
      } else {
        // Assume the module file path matches the logical module name.
        std::string safe_logical_name =
          p.LogicalName; // TODO: needs fixing for header units
        cmSystemTools::ReplaceString(safe_logical_name, ":", "-");
        mod = cmStrCat(module_dir, safe_logical_name, module_ext);
      }
      mod_files[p.LogicalName] = AvailableModuleInfo{
        mod,
        false, // Always visible within our own target.
      };
      Json::Value& module_info = target_modules[p.LogicalName] =
        Json::objectValue;
      module_info["bmi"] = mod;
      module_info["is-private"] =
        cmDyndepCollation::IsObjectPrivate(object.PrimaryOutput, export_info);
    }
  }

  cmGeneratedFileStream ddf(arg_dd);
  ddf << "ninja_dyndep_version = 1.0\n";

  {
    CxxModuleLocations locs;
    locs.RootDirectory = ".";
    locs.PathForGenerator = [this](std::string path) -> std::string {
      path = this->ConvertToNinjaPath(path);
#  ifdef _WIN32
      if (this->IsGCCOnWindows()) {
        std::replace(path.begin(), path.end(), '\\', '/');
      }
#  endif
      return path;
    };
    locs.BmiLocationForModule =
      [&mod_files](std::string const& logical) -> CxxBmiLocation {
      auto m = mod_files.find(logical);
      if (m != mod_files.end()) {
        if (m->second.IsPrivate) {
          return CxxBmiLocation::Private();
        }
        return CxxBmiLocation::Known(m->second.BmiPath);
      }
      return CxxBmiLocation::Unknown();
    };

    // Insert information about the current target's modules.
    if (modmap_fmt) {
      bool private_usage_found = false;
      auto cycle_modules =
        CxxModuleUsageSeed(locs, objects, usages, private_usage_found);
      if (!cycle_modules.empty()) {
        cmSystemTools::Error(
          cmStrCat("Circular dependency detected in the C++ module import "
                   "graph. See modules named: \"",
                   cmJoin(cycle_modules, R"(", ")"_s), '"'));
        return false;
      }
      if (private_usage_found) {
        // Already errored in the function.
        return false;
      }
    }

    cmNinjaBuild build("dyndep");
    build.Outputs.emplace_back("");
    for (cmScanDepInfo const& object : objects) {
      build.Outputs[0] = this->ConvertToNinjaPath(object.PrimaryOutput);
      build.ImplicitOuts.clear();
      for (auto const& p : object.Provides) {
        auto const implicitOut =
          this->ConvertToNinjaPath(mod_files[p.LogicalName].BmiPath);
        // Ignore the `provides` when the BMI is the output.
        if (implicitOut != build.Outputs[0]) {
          build.ImplicitOuts.emplace_back(implicitOut);
        }
      }
      build.ImplicitDeps.clear();
      for (auto const& r : object.Requires) {
        auto mit = mod_files.find(r.LogicalName);
        if (mit != mod_files.end()) {
          build.ImplicitDeps.push_back(
            this->ConvertToNinjaPath(mit->second.BmiPath));
        }
      }
      build.Variables.clear();
      if (!object.Provides.empty()) {
        build.Variables.emplace("restat", "1");
      }

      if (modmap_fmt) {
        auto mm = CxxModuleMapContent(*modmap_fmt, locs, object, usages);

        // XXX(modmap): If changing this path construction, change
        // `cmNinjaTargetGenerator::WriteObjectBuildStatements` and
        // `cmNinjaTargetGenerator::ExportObjectCompileCommand` to generate the
        // corresponding file path.
        cmGeneratedFileStream mmf(cmStrCat(object.PrimaryOutput, ".modmap"));
        mmf.SetCopyIfDifferent(true);
        mmf << mm;
      }

      this->WriteBuild(ddf, build);
    }
  }

  Json::Value target_module_info = Json::objectValue;
  target_module_info["modules"] = target_modules;

  auto& target_usages = target_module_info["usages"] = Json::objectValue;
  for (auto const& u : usages.Usage) {
    auto& mod_usage = target_usages[u.first] = Json::arrayValue;
    for (auto const& v : u.second) {
      mod_usage.append(v);
    }
  }

  auto name_for_method = [](LookupMethod method) -> cm::static_string_view {
    switch (method) {
      case LookupMethod::ByName:
        return "by-name"_s;
      case LookupMethod::IncludeAngle:
        return "include-angle"_s;
      case LookupMethod::IncludeQuote:
        return "include-quote"_s;
    }
    assert(false && "unsupported lookup method");
    return ""_s;
  };

  auto& target_references = target_module_info["references"] =
    Json::objectValue;
  for (auto const& r : usages.Reference) {
    auto& mod_ref = target_references[r.first] = Json::objectValue;
    mod_ref["path"] = r.second.Path;
    mod_ref["lookup-method"] = std::string(name_for_method(r.second.Method));
  }

  // Store the map of modules provided by this target in a file for
  // use by dependents that reference this target in linked-target-dirs.
  std::string const target_mods_file = cmStrCat(
    cmSystemTools::GetFilenamePath(arg_dd), '/', arg_lang, "Modules.json");

  // Populate the module map with those provided by linked targets first.
  for (std::string const& forward_modules_from_target_dir :
       forward_modules_from_target_dirs) {
    std::string const fmftn =
      cmStrCat(forward_modules_from_target_dir, '/', arg_lang, "Modules.json");
    Json::Value fmft;
    cmsys::ifstream fmftf(fmftn.c_str(), std::ios::in | std::ios::binary);
    if (!fmftf) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to open ",
                                    fmftn, " for module information"));
      return false;
    }
    Json::Reader reader;
    if (!reader.parse(fmftf, fmft, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    forward_modules_from_target_dir,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
    if (!fmft.isObject()) {
      continue;
    }

    auto forward_info = [](Json::Value& target, Json::Value const& source) {
      if (!source.isObject()) {
        return;
      }

      for (auto i = source.begin(); i != source.end(); ++i) {
        std::string const key = i.key().asString();
        if (target.isMember(key)) {
          continue;
        }
        target[key] = *i;
      }
    };

    // Forward info from forwarding targets into our collation.
    Json::Value& tmi_target_modules = target_module_info["modules"];
    forward_info(tmi_target_modules, fmft["modules"]);
    forward_info(target_references, fmft["references"]);
    forward_info(target_usages, fmft["usages"]);
  }

  cmGeneratedFileStream tmf(target_mods_file);
  tmf.SetCopyIfDifferent(true);
  tmf << target_module_info;

  cmDyndepMetadataCallbacks cb;
  cb.ModuleFile =
    [mod_files](std::string const& name) -> cm::optional<std::string> {
    auto m = mod_files.find(name);
    if (m != mod_files.end()) {
      return m->second.BmiPath;
    }
    return {};
  };

  return cmDyndepCollation::WriteDyndepMetadata(arg_lang, objects, export_info,
                                                cb);
}